

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

void __thiscall
Diligent::Serializer<(Diligent::SerializerMode)1>::AlignOffset
          (Serializer<(Diligent::SerializerMode)1> *this,size_t Alignment)

{
  size_t val;
  type_conflict1 tVar1;
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  unsigned_long AlignShift;
  size_t Size;
  size_t Alignment_local;
  Serializer<(Diligent::SerializerMode)1> *this_local;
  
  val = GetSize(this);
  tVar1 = AlignUp<unsigned_long,unsigned_long>(val,Alignment);
  msg.field_2._8_8_ = tVar1 - val;
  if (this->m_End < this->m_Ptr + msg.field_2._8_8_) {
    FormatString<char[26],char[28]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Ptr + AlignShift <= m_End",(char (*) [28])this);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"AlignOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x12f);
    std::__cxx11::string::~string((string *)local_48);
  }
  this->m_Ptr = this->m_Ptr + msg.field_2._8_8_;
  return;
}

Assistant:

void AlignOffset(size_t Alignment)
    {
        const auto Size       = GetSize();
        const auto AlignShift = AlignUp(Size, Alignment) - Size;
        VERIFY_EXPR(m_Ptr + AlignShift <= m_End);
        m_Ptr += AlignShift;
    }